

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O3

void __thiscall mjs::array_object::put_length(array_object *this,value *v)

{
  uint uVar1;
  uint32_t uVar2;
  global_object *g;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t index;
  double n;
  wstring local_60;
  size_type local_40;
  pointer local_38;
  
  uVar1 = this->length_;
  g = gc_heap_ptr_untracked<mjs::global_object,_true>::dereference
                ((gc_heap_ptr_untracked<mjs::global_object,_true> *)
                 &(this->super_native_object).field_0x24,
                 (this->super_native_object).super_object.heap_);
  n = to_number(v);
  uVar2 = anon_unknown_110::check_array_length(g,n);
  this->length_ = uVar2;
  if (uVar2 < uVar1) {
    index = extraout_EDX;
    do {
      index_string_abi_cxx11_(&local_60,(mjs *)(ulong)uVar2,index);
      local_40 = local_60._M_string_length;
      local_38 = local_60._M_dataplus._M_p;
      (*(this->super_native_object).super_object._vptr_object[2])(this,&local_40);
      index = extraout_EDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 4 + 4);
        index = extraout_EDX_01;
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return;
}

Assistant:

void put_length(const value& v) {
        // ES3, 15.4.5.1
        const auto old_length = length_;
        length_ = check_array_length(global_.dereference(heap()), to_number(v));
        for (auto l = length_; l < old_length; ++l) {
            delete_property(index_string(l));
        }
    }